

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool check_more_than_two_unique_values<double>
               (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  size_t ix_1;
  double x0_1;
  size_t ix;
  double x0;
  byte local_51;
  ulong local_50;
  double local_48;
  ulong local_40;
  
  if (1 < in_RDX - in_RSI) {
    local_50 = in_RSI;
    if (in_R8D == 0) {
      dVar1 = *(double *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 8);
      for (local_40 = in_RSI + 1; local_40 <= in_RDX; local_40 = local_40 + 1) {
        dVar2 = *(double *)(in_RCX + *(long *)(in_RDI + local_40 * 8) * 8);
        if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
          return true;
        }
      }
    }
    else {
      for (; local_50 <= in_RDX; local_50 = local_50 + 1) {
        uVar3 = std::isnan(*(double *)(in_RCX + *(long *)(in_RDI + local_50 * 8) * 8));
        local_51 = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf(*(double *)(in_RCX + *(long *)(in_RDI + local_50 * 8) * 8));
          local_51 = (byte)iVar4;
        }
        if (((local_51 ^ 0xff) & 1) != 0) {
          local_48 = *(double *)(in_RCX + *(long *)(in_RDI + local_50 * 8) * 8);
          local_50 = local_50 + 1;
          break;
        }
      }
      for (; local_50 <= in_RDX; local_50 = local_50 + 1) {
        uVar3 = std::isnan(*(double *)(in_RCX + *(long *)(in_RDI + local_50 * 8) * 8));
        if ((((uVar3 & 1) == 0) &&
            (uVar3 = std::isinf(*(double *)(in_RCX + *(long *)(in_RDI + local_50 * 8) * 8)),
            (uVar3 & 1) == 0)) &&
           ((dVar1 = *(double *)(in_RCX + *(long *)(in_RDI + local_50 * 8) * 8), dVar1 != local_48
            || (NAN(dVar1) || NAN(local_48))))) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_more_than_two_unique_values(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    if (end - st <= 1) return false;

    if (missing_action == Fail)
    {
        real_t x0 = x[ix_arr[st]];
        for (size_t ix = st+1; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] != x0) return true;
        }
    }

    else
    {
        real_t x0;
        size_t ix;
        for (ix = st; ix <= end; ix++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[ix]])))
            {
                x0 = x[ix_arr[ix]];
                ix++;
                break;
            }
        }

        for (; ix <= end; ix++)
        {
            if (!is_na_or_inf(x[ix_arr[ix]]) && x[ix_arr[ix]] != x0)
                return true;
        }
    }

    return false;
}